

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# seqmap.c
# Opt level: O0

void seqmap_free(seqmap_t *map)

{
  size_t local_20;
  size_t node;
  seqmap_entry_t *ent;
  seqmap_t *map_local;
  
  if (map != (seqmap_t *)0x0) {
    for (local_20 = map->len; local_20 != 0; local_20 = local_20 - 1) {
      if ((map->ptr[local_20 - 1].flags & 1U) != 0) {
        free(map->ptr[local_20 - 1].value);
      }
    }
    free(map->ptr);
    free(map);
  }
  return;
}

Assistant:

void
seqmap_free(
    seqmap_t *map)
{
    if (!map)
        return;
    seqmap_entry_t *ent;
    seqmap_for_each(map, ent)
        if (ent->flags & SEQMAP_FLAG_ALLOC)
            free(ent->value);
    free(map->ptr);
    free(map);
}